

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_free_snap_markers(fdb_snapshot_info_t *markers,uint64_t size)

{
  ulong in_RSI;
  void *in_RDI;
  int64_t kvs_idx;
  uint64_t i;
  long local_28;
  ulong local_20;
  fdb_status local_4;
  
  if ((in_RDI == (void *)0x0) || (in_RSI == 0)) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
      local_28 = *(long *)((long)in_RDI + local_20 * 0x18 + 8);
      if (local_28 != 0) {
        while (local_28 = local_28 + -1, -1 < local_28) {
          free(*(void **)(*(long *)((long)in_RDI + local_20 * 0x18 + 0x10) + local_28 * 0x10));
        }
        free(*(void **)((long)in_RDI + local_20 * 0x18 + 0x10));
      }
    }
    free(in_RDI);
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_free_snap_markers(fdb_snapshot_info_t *markers, uint64_t size) {
    uint64_t i;
    int64_t kvs_idx;
    if (!markers || !size) {
        return FDB_RESULT_INVALID_ARGS;
    }
    for (i = 0; i < size; ++i) {
        kvs_idx = markers[i].num_kvs_markers;
        if (kvs_idx) {
            for (kvs_idx = kvs_idx - 1; kvs_idx >=0; --kvs_idx) {
                free(markers[i].kvs_markers[kvs_idx].kv_store_name);
            }
            free(markers[i].kvs_markers);
        }
    }
    free(markers);
    return FDB_RESULT_SUCCESS;
}